

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

MultiFileOptions *
duckdb::MultiFileOptions::Deserialize
          (MultiFileOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  MultiFileOptions(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,100,"filename",&__return_storage_ptr__->filename);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x65,"hive_partitioning",&__return_storage_ptr__->hive_partitioning);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x66,"auto_detect_hive_partitioning",
             &__return_storage_ptr__->auto_detect_hive_partitioning);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x67,"union_by_name",&__return_storage_ptr__->union_by_name);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x68,"hive_types_autocast",&__return_storage_ptr__->hive_types_autocast);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>>
            (deserializer,0x69,"hive_types_schema",&__return_storage_ptr__->hive_types_schema);
  ::std::__cxx11::string::string((string *)&local_30,"filename",&local_31);
  Deserializer::ReadPropertyWithExplicitDefault<std::__cxx11::string>
            (deserializer,0x6a,"filename_column",&__return_storage_ptr__->filename_column,&local_30)
  ;
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

MultiFileOptions MultiFileOptions::Deserialize(Deserializer &deserializer) {
	MultiFileOptions result;
	deserializer.ReadPropertyWithDefault<bool>(100, "filename", result.filename);
	deserializer.ReadPropertyWithDefault<bool>(101, "hive_partitioning", result.hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(102, "auto_detect_hive_partitioning", result.auto_detect_hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(103, "union_by_name", result.union_by_name);
	deserializer.ReadPropertyWithDefault<bool>(104, "hive_types_autocast", result.hive_types_autocast);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<LogicalType>>(105, "hive_types_schema", result.hive_types_schema);
	deserializer.ReadPropertyWithExplicitDefault<string>(106, "filename_column", result.filename_column, MultiFileOptions::DEFAULT_FILENAME_COLUMN);
	return result;
}